

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

int __thiscall QNetworkReplyImpl::close(QNetworkReplyImpl *this,int __fd)

{
  long lVar1;
  QNetworkReplyImplPrivate *c;
  long in_FS_OFFSET;
  QNetworkReplyImplPrivate *d;
  int in_stack_ffffffffffffffbc;
  QNetworkReplyImplPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkReplyImplPrivate *)this;
  c = d_func((QNetworkReplyImpl *)0x1ec94a);
  if ((c->state != Aborted) && (c->state != Finished)) {
    if (c->backend != (QNetworkAccessBackend *)0x0) {
      (**(code **)(*(long *)c->backend + 0x70))();
    }
    if (c->copyDevice != (QIODevice *)0x0) {
      __fd = 0;
      QObject::disconnect((QObject *)c->copyDevice,(char *)0x0,(QObject *)this,(char *)0x0);
    }
    QNetworkReply::close((QNetworkReply *)this,__fd);
    tr((char *)this,(char *)c,in_stack_ffffffffffffffbc);
    QNetworkReplyImplPrivate::error(this_00,(NetworkError)((ulong)c >> 0x20),(QString *)this);
    QString::~QString((QString *)0x1eca09);
    QNetworkReplyImplPrivate::finished(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QNetworkReplyImpl::close()
{
    Q_D(QNetworkReplyImpl);
    if (d->state == QNetworkReplyPrivate::Aborted ||
        d->state == QNetworkReplyPrivate::Finished)
        return;

    // stop the download
    if (d->backend)
        d->backend->close();
    if (d->copyDevice)
        disconnect(d->copyDevice, nullptr, this, nullptr);

    QNetworkReply::close();

    // call finished which will emit signals
    d->error(OperationCanceledError, tr("Operation canceled"));
    d->finished();
}